

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_init_alloc
              (uint32_t version,uint32_t depth,uint32_t child_num,uchar *chain_code,
              size_t chain_code_len,uchar *pub_key,size_t pub_key_len,uchar *priv_key,
              size_t priv_key_len,uchar *hash160,size_t hash160_len,uchar *parent160,
              size_t parent160_len,ext_key **output)

{
  ext_key *peVar1;
  int ret;
  uchar *pub_key_local;
  size_t chain_code_len_local;
  uchar *chain_code_local;
  uint32_t child_num_local;
  uint32_t depth_local;
  uint32_t version_local;
  
  if (output == (ext_key **)0x0) {
    depth_local = 0xfffffffe;
  }
  else {
    peVar1 = (ext_key *)wally_calloc(0xc0);
    *output = peVar1;
    if (*output == (ext_key *)0x0) {
      depth_local = 0xfffffffd;
    }
    else {
      depth_local = bip32_key_init(version,depth,child_num,chain_code,chain_code_len,pub_key,
                                   pub_key_len,priv_key,priv_key_len,hash160,hash160_len,parent160,
                                   parent160_len,*output);
      if (depth_local != 0) {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return depth_local;
}

Assistant:

int bip32_key_init_alloc(uint32_t version, uint32_t depth, uint32_t child_num,
                         const unsigned char *chain_code, size_t chain_code_len,
                         const unsigned char *pub_key, size_t pub_key_len,
                         const unsigned char *priv_key, size_t priv_key_len,
                         const unsigned char *hash160, size_t hash160_len,
                         const unsigned char *parent160, size_t parent160_len,
                         struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_init(version, depth, child_num, chain_code, chain_code_len,
                         pub_key, pub_key_len, priv_key, priv_key_len,
                         hash160, hash160_len, parent160, parent160_len, *output);
    if (ret != WALLY_OK) {
        wally_free((void *)*output);
        *output = NULL;
    }
    return ret;
}